

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O0

aom_rational arg_parse_rational_helper(arg *arg,char *err_msg)

{
  char *in_RSI;
  long in_RDI;
  char *endptr;
  long rawval;
  aom_rational rat;
  char *local_28;
  long local_20;
  char *local_18;
  long local_10;
  aom_rational local_8;
  
  local_8.num = 0;
  local_8.den = 1;
  if (in_RSI != (char *)0x0) {
    *in_RSI = '\0';
  }
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = strtol(*(char **)(in_RDI + 0x10),&local_28,10);
  if ((**(char **)(local_10 + 0x10) == '\0') || (*local_28 != '/')) {
    if (local_18 != (char *)0x0) {
      snprintf(local_18,200,"Option %s: Expected / at \'%c\'\n",*(undefined8 *)(local_10 + 8),
               (ulong)(uint)(int)*local_28);
    }
  }
  else if ((local_20 < -0x80000000) || (0x7fffffff < local_20)) {
    if (local_18 != (char *)0x0) {
      snprintf(local_18,200,"Option %s: Value %ld out of range for signed int\n",
               *(undefined8 *)(local_10 + 8),local_20);
    }
  }
  else {
    local_8.num = (int)local_20;
    local_20 = strtol(local_28 + 1,&local_28,10);
    if ((**(char **)(local_10 + 0x10) == '\0') || (*local_28 != '\0')) {
      if (local_18 != (char *)0x0) {
        snprintf(local_18,200,"Option %s: Invalid character \'%c\'\n",*(undefined8 *)(local_10 + 8),
                 (ulong)(uint)(int)*local_28);
      }
    }
    else if ((local_20 < -0x80000000) || (0x7fffffff < local_20)) {
      if (local_18 != (char *)0x0) {
        snprintf(local_18,200,"Option %s: Value %ld out of range for signed int\n",
                 *(undefined8 *)(local_10 + 8),local_20);
      }
    }
    else {
      local_8.den = (int)local_20;
    }
  }
  return local_8;
}

Assistant:

struct aom_rational arg_parse_rational_helper(const struct arg *arg,
                                              char *err_msg) {
  long rawval;  // NOLINT
  char *endptr;
  struct aom_rational rat = { 0, 1 };

  if (err_msg) err_msg[0] = '\0';

  /* parse numerator */
  rawval = strtol(arg->val, &endptr, 10);

  if (arg->val[0] != '\0' && endptr[0] == '/') {
    if (rawval >= INT_MIN && rawval <= INT_MAX) {
      rat.num = (int)rawval;
    } else {
      SET_ERR_STRING("Option %s: Value %ld out of range for signed int\n",
                     arg->name, rawval);
      return rat;
    }
  } else {
    SET_ERR_STRING("Option %s: Expected / at '%c'\n", arg->name, *endptr);
    return rat;
  }

  /* parse denominator */
  rawval = strtol(endptr + 1, &endptr, 10);

  if (arg->val[0] != '\0' && endptr[0] == '\0') {
    if (rawval >= INT_MIN && rawval <= INT_MAX) {
      rat.den = (int)rawval;
    } else {
      SET_ERR_STRING("Option %s: Value %ld out of range for signed int\n",
                     arg->name, rawval);
      return rat;
    }
  } else {
    SET_ERR_STRING("Option %s: Invalid character '%c'\n", arg->name, *endptr);
    return rat;
  }

  return rat;
}